

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

bool __thiscall cmGhsMultiTargetGenerator::DetermineIfIntegrityApp(cmGhsMultiTargetGenerator *this)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  char *pcVar3;
  reference ppcVar4;
  string *__rhs;
  cmSourceFile **sf;
  iterator __end1;
  iterator __begin1;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range1;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string local_78;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *p;
  cmGhsMultiTargetGenerator *this_local;
  
  pcVar1 = this->GeneratorTarget;
  p = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"ghs_integrity_app",&local_41);
  pcVar3 = cmGeneratorTarget::GetProperty(pcVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = pcVar3;
  if (pcVar3 == (char *)0x0) {
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1);
    cmGeneratorTarget::GetSourceFiles
              (this->GeneratorTarget,
               (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1,
               &this->ConfigName);
    __end1 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                       ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1);
    sf = (cmSourceFile **)
         std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                   ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                  *)&sf);
      if (!bVar2) break;
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                ::operator*(&__end1);
      __rhs = cmSourceFile::GetExtension_abi_cxx11_(*ppcVar4);
      bVar2 = std::operator==("int",__rhs);
      if (bVar2) {
        this_local._7_1_ = 1;
        goto LAB_003efa8b;
      }
      __gnu_cxx::
      __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = 0;
LAB_003efa8b:
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1);
  }
  else {
    pcVar1 = this->GeneratorTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"ghs_integrity_app",
               (allocator<char> *)
               ((long)&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar3 = cmGeneratorTarget::GetProperty(pcVar1,&local_78);
    this_local._7_1_ = cmSystemTools::IsOn(pcVar3);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGhsMultiTargetGenerator::DetermineIfIntegrityApp()
{
  const char* p = this->GeneratorTarget->GetProperty("ghs_integrity_app");
  if (p) {
    return cmSystemTools::IsOn(
      this->GeneratorTarget->GetProperty("ghs_integrity_app"));
  }
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(sources, this->ConfigName);
  for (auto& sf : sources) {
    if ("int" == sf->GetExtension()) {
      return true;
    }
  }
  return false;
}